

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTune.c
# Opt level: O3

void Ifn_NtkMatchPrintConfig(Ifn_Ntk_t *p,sat_solver *pSat)

{
  int iVar1;
  uint uVar2;
  Ifn_Obj_t *pIVar3;
  uint v;
  
  v = p->nObjs;
  if ((int)v < p->nPars) {
    do {
      iVar1 = p->nInps;
      if (iVar1 < p->nObjs) {
        pIVar3 = p->Nodes + iVar1;
        iVar1 = p->nObjs - iVar1;
        do {
          if (((*(uint *)pIVar3 & 7) == 6) && ((*(uint *)pIVar3 >> 8 & 0xff) == v)) {
            putchar(0x20);
            goto LAB_003aa3ea;
          }
          pIVar3 = pIVar3 + 1;
          iVar1 = iVar1 + -1;
        } while (iVar1 != 0);
      }
      iVar1 = v - p->nParsVIni;
      if ((p->nParsVIni <= (int)v) && (iVar1 % p->nParsVNum == 0)) {
        printf(" %d=",(long)iVar1 / (long)p->nParsVNum & 0xffffffff);
      }
LAB_003aa3ea:
      uVar2 = sat_solver_var_value(pSat,v);
      printf("%d",(ulong)uVar2);
      v = v + 1;
    } while ((int)v < p->nPars);
  }
  return;
}

Assistant:

void Ifn_NtkMatchPrintConfig( Ifn_Ntk_t * p, sat_solver * pSat )
{
    int v, i;
    for ( v = p->nObjs; v < p->nPars; v++ )
    {
        for ( i = p->nInps; i < p->nObjs; i++ )
            if ( p->Nodes[i].Type == IFN_DSD_PRIME && (int)p->Nodes[i].iFirst == v )
                break;
        if ( i < p->nObjs )
            printf( " " );
        else if ( v >= p->nParsVIni && (v - p->nParsVIni) % p->nParsVNum == 0 )
            printf( " %d=", (v - p->nParsVIni) / p->nParsVNum );
        printf( "%d", sat_solver_var_value(pSat, v) );
    }
}